

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rt_rt.hpp
# Opt level: O2

type * viennamath::result_of::
       add<viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_false,_false>
       ::instance(type *__return_storage_ptr__,
                 rt_variable<viennamath::rt_expression_interface<double>_> *lhs,
                 rt_expr<viennamath::rt_expression_interface<double>_> *rhs)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar3;
  undefined4 extraout_var_00;
  
  iVar1 = (*(lhs->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(lhs);
  poVar3 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar3->_vptr_op_interface = (_func_int **)&PTR__op_interface_00128208;
  iVar2 = (*((rhs->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[2])();
  (__return_storage_ptr__->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_00127c18;
  (__return_storage_ptr__->lhs_)._M_ptr =
       (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1);
  (__return_storage_ptr__->op_)._M_ptr = poVar3;
  (__return_storage_ptr__->rhs_)._M_ptr =
       (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar2);
  return __return_storage_ptr__;
}

Assistant:

static type instance(LHS const & lhs, RHS const & rhs) { return type(traits::clone<iface_type>(lhs), new op_binary<op_plus<numeric_type>, iface_type>(), traits::clone<iface_type>(rhs)); }